

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void readImageData(FILE *flagData,png_structpp png_ptr,png_infopp info_ptr)

{
  int iVar1;
  long lVar2;
  __jmp_buf_tag *__env;
  long *in_RDX;
  long *in_RSI;
  FILE *in_RDI;
  
  if (((in_RDI != (FILE *)0x0) && (in_RSI != (long *)0x0)) && (in_RDX != (long *)0x0)) {
    lVar2 = png_create_read_struct("1.6.37",0,0);
    *in_RSI = lVar2;
    if (*in_RSI != 0) {
      lVar2 = png_create_info_struct(*in_RSI);
      *in_RDX = lVar2;
      if (*in_RDX == 0) {
        png_destroy_read_struct(in_RSI,0);
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(*in_RSI,longjmp,200);
        iVar1 = _setjmp(__env);
        if (iVar1 == 0) {
          png_init_io(*in_RSI,in_RDI);
          png_set_sig_bytes(*in_RSI,8);
          png_read_png(*in_RSI,*in_RDX,0x2004,0);
          fclose(in_RDI);
        }
        else {
          png_destroy_read_struct(in_RSI,in_RDX,0);
          printf("The has been an issue when reading the file. If only I knew...\n");
        }
      }
    }
  }
  return;
}

Assistant:

void readImageData (FILE *flagData, png_structpp png_ptr, png_infopp info_ptr)
{
	if (flagData == NULL || png_ptr == NULL || info_ptr == NULL)
		return;
	/* Initialization */
	*png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING,NULL,NULL,NULL);
	if (*png_ptr == NULL)
		return;
	*info_ptr = png_create_info_struct(*png_ptr);
	if (*info_ptr == NULL)
	{
		png_destroy_read_struct(png_ptr, NULL, NULL);
		return;
	}
	if (setjmp(png_jmpbuf(*png_ptr)))
	{
		/* Free all of the memory associated with the png_ptr and info_ptr */
		png_destroy_read_struct(png_ptr, info_ptr, NULL);
		/* If we get here, we had a problem reading the file. */
		printf("The has been an issue when reading the file. If only I knew...\n");
		return;
	}
	png_init_io(*png_ptr, flagData);

	/* Start reading data from the file (except for the signature, which has been read before) */
	png_set_sig_bytes(*png_ptr, 8);
	png_read_png(*png_ptr, *info_ptr, PNG_TRANSFORM_PACKING | PNG_TRANSFORM_GRAY_TO_RGB, NULL);
	fclose(flagData);
	return;
}